

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cc
# Opt level: O3

void __thiscall HighVariable::printInfo(HighVariable *this,ostream *s)

{
  Varnode *this_00;
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  pointer ppVVar4;
  
  updateType(this);
  if (this->symbol == (Symbol *)0x0) {
    pcVar3 = "Variable: UNNAMED";
    lVar2 = 0x11;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(s,"Variable: ",10);
    std::__ostream_insert<char,std::char_traits<char>>
              (s,(this->symbol->name)._M_dataplus._M_p,(this->symbol->name)._M_string_length);
    if (this->symboloffset == -1) goto LAB_0027be60;
    pcVar3 = "(partial)";
    lVar2 = 9;
  }
  std::__ostream_insert<char,std::char_traits<char>>(s,pcVar3,lVar2);
LAB_0027be60:
  std::ios::widen((char)*(undefined8 *)(*(long *)s + -0x18) + (char)s);
  std::ostream::put((char)s);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(s,"Type: ",6);
  (*this->type->_vptr_Datatype[3])(this->type,s);
  std::__ostream_insert<char,std::char_traits<char>>(s,"\n\n",2);
  ppVVar4 = (this->inst).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppVVar4 !=
      (this->inst).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      this_00 = *ppVVar4;
      *(uint *)(s + *(long *)(*(long *)s + -0x18) + 0x18) =
           *(uint *)(s + *(long *)(*(long *)s + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar1 = (ostream *)std::ostream::operator<<(s,this_00->mergegroup);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
      Varnode::printInfo(this_00,s);
      ppVVar4 = ppVVar4 + 1;
    } while (ppVVar4 !=
             (this->inst).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void HighVariable::printInfo(ostream &s) const

{
  vector<Varnode *>::const_iterator viter;
  Varnode *vn;

  updateType();
  if (symbol == (Symbol *)0) {
    s << "Variable: UNNAMED" << endl;
  }
  else {
    s << "Variable: " << symbol->getName();
    if (symboloffset!=-1)
      s << "(partial)";
    s << endl;
  }
  s << "Type: ";
  type->printRaw(s);
  s << "\n\n";
				
  for(viter=inst.begin();viter!=inst.end();++viter) {
    vn = *viter;
    s << dec << vn->getMergeGroup() << ": ";
    vn->printInfo(s);
  }
}